

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiViewportP::~ImGuiViewportP(ImGuiViewportP *this)

{
  if (this->DrawLists[0] != (ImDrawList *)0x0) {
    IM_DELETE<ImDrawList>(this->DrawLists[0]);
  }
  if (this->DrawLists[1] != (ImDrawList *)0x0) {
    IM_DELETE<ImDrawList>(this->DrawLists[1]);
  }
  ImDrawDataBuilder::~ImDrawDataBuilder(&this->DrawDataBuilder);
  (this->DrawDataP).Valid = false;
  (this->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
  (this->DrawDataP).CmdLists = (ImDrawList **)0x0;
  (this->DrawDataP).CmdListsCount = 0;
  (this->DrawDataP).TotalIdxCount = 0;
  (this->DrawDataP).TotalVtxCount = 0;
  (this->DrawDataP).DisplayPos.x = 0.0;
  *(undefined8 *)&(this->DrawDataP).DisplayPos.y = 0;
  (this->DrawDataP).DisplaySize.x = 0.0;
  (this->DrawDataP).DisplaySize.y = 0.0;
  (this->DrawDataP).FramebufferScale.x = 0.0;
  (this->DrawDataP).FramebufferScale.y = 0.0;
  ImGuiViewport::~ImGuiViewport(&this->super_ImGuiViewport);
  return;
}

Assistant:

~ImGuiViewportP()               { if (DrawLists[0]) IM_DELETE(DrawLists[0]); if (DrawLists[1]) IM_DELETE(DrawLists[1]); }